

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O1

uint __thiscall QXmlStreamReaderPrivate::filterCarriageReturn(QXmlStreamReaderPrivate *this)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  uint *puVar4;
  uint uVar5;
  long lVar6;
  
  lVar3 = (this->putStack).tos;
  if (lVar3 == -1) {
    if (this->readBufferPos < (this->readBuffer).d.size) {
      uVar5 = (uint)(ushort)(this->readBuffer).d.ptr[this->readBufferPos];
    }
    else {
      uVar5 = getChar_helper(this);
      if (uVar5 == 0xffffffff) {
        uVar5 = 0xffffffff;
      }
      else {
        this->readBufferPos = this->readBufferPos + -1;
      }
    }
  }
  else {
    uVar5 = (this->putStack).data[lVar3];
  }
  if (uVar5 == 0xffffffff) {
    lVar3 = (this->putStack).tos;
    lVar1 = (this->putStack).cap;
    if (lVar1 <= lVar3 + 1) {
      lVar3 = lVar3 + 2;
      lVar6 = lVar1 * 2;
      if (lVar3 != lVar6 && SBORROW8(lVar3,lVar6) == lVar3 + lVar1 * -2 < 0) {
        lVar6 = lVar3;
      }
      (this->putStack).cap = lVar6;
      puVar4 = (uint *)realloc((this->putStack).data,lVar6 << 2);
      (this->putStack).data = puVar4;
      if (puVar4 == (uint *)0x0) {
        qBadAlloc();
      }
    }
    lVar3 = (this->putStack).tos;
    (this->putStack).tos = lVar3 + 1;
    (this->putStack).data[lVar3 + 1] = 0xd;
    uVar2 = 0;
  }
  else {
    uVar2 = 10;
    if (uVar5 == 10) {
      lVar3 = (this->putStack).tos;
      if (lVar3 == -1) {
        this->readBufferPos = this->readBufferPos + 1;
      }
      else {
        (this->putStack).tos = lVar3 + -1;
      }
    }
  }
  return uVar2;
}

Assistant:

inline uint QXmlStreamReaderPrivate::filterCarriageReturn()
{
    uint peekc = peekChar();
    if (peekc == '\n') {
        if (putStack.size())
            putStack.pop();
        else
            ++readBufferPos;
        return peekc;
    }
    if (peekc == StreamEOF) {
        putChar('\r');
        return 0;
    }
    return '\n';
}